

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O1

void __thiscall http::Page::SendASCIIString(Page *this,char *string)

{
  byte *pbVar1;
  undefined8 in_RAX;
  ulong uVar2;
  size_t length;
  char *p;
  undefined8 in_R8;
  undefined8 in_R9;
  char buffer [4];
  ulong uVar3;
  
  uVar2 = CONCAT71((int7)((ulong)in_RAX >> 8),*string);
  if (*string != '\0') {
    uVar3 = uVar2;
    do {
      if ((byte)((char)uVar2 + 0x81U) < 0xa2) {
        snprintf(&stack0xffffffffffffffdc,4,"%%%02X",(ulong)(uint)(int)(char)uVar2,in_R8,in_R9,uVar3
                );
        length = 3;
        p = &stack0xffffffffffffffdc;
      }
      else {
        length = 1;
        p = string;
      }
      RawSend(this,p,length);
      pbVar1 = (byte *)(string + 1);
      uVar2 = (ulong)*pbVar1;
      string = string + 1;
    } while (*pbVar1 != 0);
  }
  return;
}

Assistant:

void http::Page::SendASCIIString(const char* string)
{
    char buffer[4];

    while (*string)
    {
        if (*string < 0x21 || *string > 0x7E)
        {
            snprintf(buffer, sizeof(buffer), "%%%02X", *string);
            RawSend(buffer, 3);
        }
        else
        {
            RawSend(string, 1);
        }
        string++;
    }
}